

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O0

Ptr<ImageView>
myvk::ImageView::Create
          (Ptr<ImageBase> *image,VkImageViewType view_type,VkImageAspectFlags aspect_mask)

{
  element_type *peVar1;
  uint32_t in_ECX;
  VkImageAspectFlags in_EDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  Ptr<ImageView> PVar2;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  VkComponentMapping *in_stack_00000028;
  element_type *image_00;
  
  image_00 = in_RDI;
  peVar1 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ce2df);
  ImageBase::GetFormat(peVar1);
  peVar1 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ce2fd);
  ImageBase::GetMipLevels(peVar1);
  peVar1 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ce313);
  ImageBase::GetArrayLayers(peVar1);
  PVar2 = Create((Ptr<ImageBase> *)image_00,(VkImageViewType)((ulong)in_RSI >> 0x20),
                 (VkFormat)in_RSI,in_EDX,in_ECX,in_stack_00000010,in_stack_00000018,
                 in_stack_00000020,in_stack_00000028);
  PVar2.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<ImageView>)PVar2.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<ImageBase> &image, VkImageViewType view_type,
                                 VkImageAspectFlags aspect_mask) {
	return Create(image, view_type, image->GetFormat(), aspect_mask, 0, image->GetMipLevels(), 0,
	              image->GetArrayLayers());
}